

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_subcommands_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,App *app,AppFormatMode mode)

{
  App *pAVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  ostream *poVar5;
  reference ppAVar6;
  ulong uVar7;
  string *psVar8;
  bool local_3a9;
  string local_378;
  string local_358;
  string local_338 [32];
  App *local_318;
  App *new_com;
  iterator __end2;
  iterator __begin2;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__range2;
  function<bool_(const_CLI::App_*)> local_2f0;
  undefined1 local_2d0 [8];
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands_group;
  string *group;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_280;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  undefined1 local_270 [8];
  string group_key;
  App *com;
  iterator __end1;
  iterator __begin1;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subcmd_groups_seen;
  function<bool_(const_CLI::App_*)> local_1e8;
  undefined1 local_1c8 [8];
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  stringstream out;
  ostream local_1a0 [380];
  AppFormatMode local_24;
  App *pAStack_20;
  AppFormatMode mode_local;
  App *app_local;
  Formatter *this_local;
  
  local_24 = mode;
  pAStack_20 = app;
  app_local = (App *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream
            ((stringstream *)
             &subcommands.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pAVar1 = pAStack_20;
  std::function<bool_(const_CLI::App_*)>::function(&local_1e8);
  App::get_subcommands
            ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_1c8,pAVar1,
             &local_1e8);
  std::function<bool_(const_CLI::App_*)>::~function(&local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  __end1 = std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::begin
                     ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_1c8);
  com = (App *)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::end
                         ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_1c8);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                                     *)&com), bVar2) {
    ppAVar6 = __gnu_cxx::
              __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
              ::operator*(&__end1);
    pAVar1 = *ppAVar6;
    App::get_name_abi_cxx11_(pAVar1);
    uVar7 = ::std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      psVar8 = App::get_group_abi_cxx11_(pAVar1);
      ::std::__cxx11::string::string((string *)local_270,(string *)psVar8);
      uVar3 = ::std::__cxx11::string::empty();
      local_3a9 = false;
      if ((uVar3 & 1) == 0) {
        local_280._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
        local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range1);
        local_290 = (string *)local_270;
        local_278 = ::std::
                    find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_subcommands(CLI::App_const*,CLI::AppFormatMode)const::_lambda(std::__cxx11::string)_1_>
                              (local_280,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )local_288,(anon_class_8_1_bd38f33f_for__M_pred)local_290);
        __range1_1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&__range1);
        local_3a9 = __gnu_cxx::operator==
                              (&local_278,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&__range1_1);
      }
      if (local_3a9 != false) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1,(value_type *)local_270);
      }
      ::std::__cxx11::string::~string((string *)local_270);
    }
    else {
      App::get_group_abi_cxx11_(pAVar1);
      uVar7 = ::std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        App::get_group_abi_cxx11_(pAVar1);
        pcVar4 = (char *)::std::__cxx11::string::front();
        if (*pcVar4 != '+') {
          (*(this->super_FormatterBase)._vptr_FormatterBase[7])
                    ((undefined1 *)((long)&group_key.field_2 + 8),this,pAVar1,(ulong)local_24);
          ::std::operator<<(local_1a0,(string *)(group_key.field_2._M_local_buf + 8));
          ::std::__cxx11::string::~string((string *)(group_key.field_2._M_local_buf + 8));
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
  group = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&group), bVar2) {
    subcommands_group.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1_1);
    poVar5 = ::std::operator<<(local_1a0,'\n');
    poVar5 = ::std::operator<<(poVar5,(string *)
                                      subcommands_group.
                                      super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::operator<<(poVar5,":\n");
    pAVar1 = pAStack_20;
    __range2 = (vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
               subcommands_group.
               super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    ::std::function<bool(CLI::App_const*)>::
    function<CLI::Formatter::make_subcommands[abi:cxx11](CLI::App_const*,CLI::AppFormatMode)const::_lambda(CLI::App_const*)_1_,void>
              ((function<bool(CLI::App_const*)> *)&local_2f0,(anon_class_8_1_a7fae59f *)&__range2);
    App::get_subcommands
              ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_2d0,pAVar1,
               &local_2f0);
    std::function<bool_(const_CLI::App_*)>::~function(&local_2f0);
    __end2 = std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::begin
                       ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_2d0);
    new_com = (App *)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::end
                               ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                                local_2d0);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                                       *)&new_com), bVar2) {
      ppAVar6 = __gnu_cxx::
                __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                ::operator*(&__end2);
      local_318 = *ppAVar6;
      App::get_name_abi_cxx11_(local_318);
      uVar7 = ::std::__cxx11::string::empty();
      pAVar1 = local_318;
      if ((uVar7 & 1) == 0) {
        if (local_24 == All) {
          psVar8 = App::get_name_abi_cxx11_(local_318);
          ::std::__cxx11::string::string((string *)&local_378,(string *)psVar8);
          App::help(&local_358,pAVar1,&local_378,Sub);
          ::std::operator<<(local_1a0,(string *)&local_358);
          ::std::__cxx11::string::~string((string *)&local_358);
          ::std::__cxx11::string::~string((string *)&local_378);
          ::std::operator<<(local_1a0,'\n');
        }
        else {
          (*(this->super_FormatterBase)._vptr_FormatterBase[6])(local_338,this,local_318);
          ::std::operator<<(local_1a0,local_338);
          ::std::__cxx11::string::~string(local_338);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~vector
              ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_2d0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  ::std::__cxx11::stringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~vector
            ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)local_1c8);
  ::std::__cxx11::stringstream::~stringstream
            ((stringstream *)
             &subcommands.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_subcommands(const App *app, AppFormatMode mode) const {
    std::stringstream out;

    std::vector<const App *> subcommands = app->get_subcommands({});

    // Make a list in definition order of the groups seen
    std::vector<std::string> subcmd_groups_seen;
    for(const App *com : subcommands) {
        if(com->get_name().empty()) {
            if(!com->get_group().empty() && com->get_group().front() != '+') {
                out << make_expanded(com, mode);
            }
            continue;
        }
        std::string group_key = com->get_group();
        if(!group_key.empty() &&
           std::find_if(subcmd_groups_seen.begin(), subcmd_groups_seen.end(), [&group_key](std::string a) {
               return detail::to_lower(a) == detail::to_lower(group_key);
           }) == subcmd_groups_seen.end())
            subcmd_groups_seen.push_back(group_key);
    }

    // For each group, filter out and print subcommands
    for(const std::string &group : subcmd_groups_seen) {
        out << '\n' << group << ":\n";
        std::vector<const App *> subcommands_group = app->get_subcommands(
            [&group](const App *sub_app) { return detail::to_lower(sub_app->get_group()) == detail::to_lower(group); });
        for(const App *new_com : subcommands_group) {
            if(new_com->get_name().empty())
                continue;
            if(mode != AppFormatMode::All) {
                out << make_subcommand(new_com);
            } else {
                out << new_com->help(new_com->get_name(), AppFormatMode::Sub);
                out << '\n';
            }
        }
    }

    return out.str();
}